

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

int stream_is_destroyable(quicly_stream_t *stream)

{
  quicly_sender_state_t qVar1;
  uint64_t uVar2;
  
  if ((((stream->recvstate).received.num_ranges == 0) &&
      (uVar2 = (stream->sendstate).final_size, uVar2 != 0xffffffffffffffff)) &&
     (((stream->sendstate).acked.ranges)->end == uVar2 + 1)) {
    qVar1 = (stream->_send_aux).reset_stream.sender_state;
    return (int)(qVar1 == QUICLY_SENDER_STATE_ACKED || qVar1 == QUICLY_SENDER_STATE_NONE);
  }
  return 0;
}

Assistant:

static int stream_is_destroyable(quicly_stream_t *stream)
{
    if (!quicly_recvstate_transfer_complete(&stream->recvstate))
        return 0;
    if (!quicly_sendstate_transfer_complete(&stream->sendstate))
        return 0;
    switch (stream->_send_aux.reset_stream.sender_state) {
    case QUICLY_SENDER_STATE_NONE:
    case QUICLY_SENDER_STATE_ACKED:
        break;
    default:
        return 0;
    }
    return 1;
}